

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O0

void __thiscall Enemy::setup(Enemy *this,Spritesheet *spritesheet)

{
  reference pvVar1;
  Spritesheet *spritesheet_local;
  Enemy *this_local;
  
  (this->startPos).field_0 = (this->super_AABB).center.field_0;
  pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&spritesheet->sprites,0x23);
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[0].frames,pvVar1);
  pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&spritesheet->sprites,0x24);
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[0].frames,pvVar1);
  pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&spritesheet->sprites,0x25);
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[1].frames,pvVar1);
  return;
}

Assistant:

void Enemy::setup(piksel::Spritesheet& spritesheet) {
    startPos = center;

    animations[WALKING].frames.push_back(spritesheet.sprites[35]);
    animations[WALKING].frames.push_back(spritesheet.sprites[36]);

    animations[DEAD].frames.push_back(spritesheet.sprites[37]);
}